

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O2

int http_SendMessage(SOCKINFO *info,int *TimeOut,char *fmt,...)

{
  char cVar1;
  uint uVar2;
  char in_AL;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong *puVar6;
  undefined8 *puVar7;
  void *__ptr;
  FILE *__stream;
  size_t sVar8;
  undefined8 in_RCX;
  ulong uVar9;
  char *pcVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar11;
  bool bVar12;
  size_t sVar13;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int *local_140;
  va_list argp;
  size_t local_118;
  char *local_110;
  char Chunk_Header [10];
  ulong local_e8 [5];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  Chunk_Header[0] = '\0';
  Chunk_Header[1] = '\0';
  Chunk_Header[2] = '\0';
  Chunk_Header[3] = '\0';
  Chunk_Header[4] = '\0';
  Chunk_Header[5] = '\0';
  Chunk_Header[6] = '\0';
  Chunk_Header[7] = '\0';
  Chunk_Header[8] = '\0';
  Chunk_Header[9] = '\0';
  uVar5 = 0x18;
  argp[0].overflow_arg_area = &stack0x00000008;
  local_118 = 0x100000;
  __ptr = (void *)0x0;
  sVar11 = 0;
  local_110 = (char *)0x0;
  bVar12 = false;
  local_140 = (int *)0x0;
  local_e8[3] = in_RCX;
  local_e8[4] = in_R8;
  local_c0 = in_R9;
  do {
    do {
      while( true ) {
        while( true ) {
          pcVar10 = fmt + 1;
          cVar1 = *fmt;
          if (cVar1 == '\0') goto LAB_0011780a;
          fmt = pcVar10;
          if (cVar1 != 'I' || bVar12) break;
          uVar9 = (ulong)uVar5;
          if (uVar9 < 0x29) {
            uVar5 = uVar5 + 8;
            puVar7 = (undefined8 *)((long)local_e8 + uVar9);
          }
          else {
            puVar7 = (undefined8 *)argp[0].overflow_arg_area;
            argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
          }
          local_140 = (int *)*puVar7;
          sVar11 = *(size_t *)(local_140 + 0x6a);
          if ((long)*(size_t *)(local_140 + 0x6a) < 0) {
            sVar11 = local_118;
          }
          if ((long)sVar11 < 0x100000) {
            local_118 = sVar11;
          }
          __ptr = malloc(local_118 + 0x14);
          if (__ptr == (void *)0x0) {
            __ptr = (void *)0x0;
            iVar4 = -0x68;
            goto LAB_00117811;
          }
          local_110 = (char *)((long)__ptr + 10);
          bVar12 = true;
        }
        if (cVar1 == 'b') break;
        if (cVar1 == 'f') {
          if ((ulong)uVar5 < 0x29) {
            argp[0].overflow_arg_area = (void *)((long)local_e8 + (ulong)uVar5);
          }
          if ((local_140 == (int *)0x0) || (*local_140 == 0)) {
            __stream = fopen(*argp[0].overflow_arg_area,"rb");
            if (__stream != (FILE *)0x0) {
              if (local_140 != (int *)0x0) goto LAB_001178a2;
              goto LAB_001178fe;
            }
          }
          else {
            __stream = (FILE *)(*virtualDirCallback.open)
                                         (*argp[0].overflow_arg_area,UPNP_READ,
                                          *(void **)(local_140 + 0x70),*(void **)(local_140 + 0x72))
            ;
            if (__stream != (FILE *)0x0) {
LAB_001178a2:
              if (local_140[2] != 0) {
                if (*local_140 == 0) {
                  iVar3 = fseeko(__stream,*(__off_t *)(local_140 + 0x68),1);
                }
                else {
                  iVar3 = (*virtualDirCallback.seek)
                                    (__stream,*(off_t *)(local_140 + 0x68),1,
                                     *(void **)(local_140 + 0x70),*(void **)(local_140 + 0x72));
                }
                iVar4 = -0x1f7;
                if (iVar3 != 0) goto LAB_00117b0a;
              }
LAB_001178fe:
              goto LAB_00117903;
            }
          }
          iVar4 = -0x1f7;
          goto LAB_00117811;
        }
      }
      uVar9 = (ulong)uVar5;
      if (uVar9 < 0x29) {
        pcVar10 = *(char **)((long)local_e8 + uVar9);
        uVar2 = uVar5 + 8;
        if (0x20 < uVar5) goto LAB_00117723;
        puVar6 = (ulong *)((long)local_e8 + uVar9 + 8);
        uVar5 = uVar5 + 0x10;
      }
      else {
        pcVar10 = *argp[0].overflow_arg_area;
        argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
        uVar2 = uVar5;
LAB_00117723:
        puVar6 = (ulong *)argp[0].overflow_arg_area;
        argp[0].overflow_arg_area = (void *)((long)argp[0].overflow_arg_area + 8);
        uVar5 = uVar2;
      }
      uVar9 = *puVar6;
    } while (uVar9 == 0);
    iVar4 = sock_write(info,pcVar10,uVar9,TimeOut);
    UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x2c4,
               ">>> (SENT) >>>\n%.*s\nbuf_length=%zd, num_written=%zd\n------------\n",
               uVar9 & 0xffffffff,pcVar10,uVar9,(long)iVar4);
  } while (uVar9 == (long)iVar4);
LAB_0011780a:
  iVar4 = 0;
LAB_00117811:
  free(__ptr);
  return iVar4;
LAB_00117903:
  if (sVar11 == 0) goto LAB_00117ab4;
  if (local_140 != (int *)0x0) {
    sVar13 = sVar11;
    if ((long)local_118 <= (long)sVar11) {
      sVar13 = local_118;
    }
    if (*local_140 == 0) {
      sVar13 = fread(local_110,1,sVar13,__stream);
    }
    else {
      iVar4 = (*virtualDirCallback.read)
                        (__stream,local_110,sVar13,*(void **)(local_140 + 0x70),
                         *(void **)(local_140 + 0x72));
      sVar13 = (size_t)iVar4;
    }
    sVar11 = sVar11 - sVar13;
    if (*(long *)(local_140 + 0x6a) < 0) {
      sVar11 = local_118;
    }
    if (sVar13 == 0) {
      if (local_140[1] == 0) {
        iVar4 = -0x1f7;
        goto LAB_00117b0a;
      }
      sock_write(info,"0\r\n\r\n",5,TimeOut);
    }
    else {
      if (local_140[1] == 0) goto LAB_00117a5b;
      (local_110 + sVar13)[0] = '\r';
      (local_110 + sVar13)[1] = '\n';
      Chunk_Header[8] = '\0';
      Chunk_Header[9] = '\0';
      Chunk_Header[0] = '\0';
      Chunk_Header[1] = '\0';
      Chunk_Header[2] = '\0';
      Chunk_Header[3] = '\0';
      Chunk_Header[4] = '\0';
      Chunk_Header[5] = '\0';
      Chunk_Header[6] = '\0';
      Chunk_Header[7] = '\0';
      uVar5 = snprintf(Chunk_Header,10,"%zx\r\n",sVar13);
      if (9 < uVar5) {
        iVar4 = -0x38f;
        goto LAB_00117b0a;
      }
      sVar8 = strlen(Chunk_Header);
      memcpy(local_110 + -sVar8,Chunk_Header,sVar8);
      sVar8 = strlen(Chunk_Header);
      uVar5 = sock_write(info,local_110 + -sVar8,sVar13 + sVar8 + 2,TimeOut);
      if ((0 < (int)uVar5) && (sVar8 = strlen(Chunk_Header), sVar8 + sVar13 + 2 == (ulong)uVar5))
      goto LAB_00117903;
    }
    iVar4 = 0;
    goto LAB_00117b0a;
  }
  sVar13 = fread(local_110,1,local_118,__stream);
  if (sVar13 == 0) {
    iVar4 = -0x1f7;
    goto LAB_00117b2c;
  }
LAB_00117a5b:
  uVar5 = sock_write(info,local_110,sVar13,TimeOut);
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x2a1,
             ">>> (SENT) >>>\n%.*s\n------------\n",(ulong)uVar5,local_110);
  if (((int)uVar5 < 1) || (sVar13 != (long)(int)uVar5)) goto LAB_00117ab4;
  goto LAB_00117903;
LAB_00117ab4:
  iVar4 = 0;
  if (local_140 != (int *)0x0) {
LAB_00117b0a:
    if (*local_140 != 0) {
      (*virtualDirCallback.close)
                (__stream,*(void **)(local_140 + 0x70),*(void **)(local_140 + 0x72));
      goto LAB_00117811;
    }
  }
LAB_00117b2c:
  fclose(__stream);
  goto LAB_00117811;
}

Assistant:

int http_SendMessage(SOCKINFO *info, int *TimeOut, const char *fmt, ...)
{
#if EXCLUDE_WEB_SERVER == 0
	FILE *Fp;
	struct SendInstruction *Instr = NULL;
	char *filename = NULL;
	char *file_buf = NULL;
	char *ChunkBuf = NULL;
	/* 10 byte allocated for chunk header. */
	char Chunk_Header[CHUNK_HEADER_SIZE];
	size_t num_read;
	off_t amount_to_be_read = 0;
	size_t Data_Buf_Size = WEB_SERVER_BUF_SIZE;
#endif /* EXCLUDE_WEB_SERVER */
	va_list argp;
	char *buf = NULL;
	char c;
	int nw;
	int RetVal = 0;
	size_t buf_length;
	size_t num_written;
	int I_fmt_processed = 0;

#if EXCLUDE_WEB_SERVER == 0
	memset(Chunk_Header, 0, sizeof(Chunk_Header));
#endif /* EXCLUDE_WEB_SERVER */
	va_start(argp, fmt);
	while ((c = *fmt++)) {
#if EXCLUDE_WEB_SERVER == 0
		if (c == 'I' && !I_fmt_processed) {
			I_fmt_processed = 1;
			Instr = va_arg(argp, struct SendInstruction *);
			if (Instr->ReadSendSize >= 0)
				amount_to_be_read = Instr->ReadSendSize;
			else
				amount_to_be_read = (off_t)Data_Buf_Size;
			if (amount_to_be_read < (off_t)WEB_SERVER_BUF_SIZE)
				Data_Buf_Size = (size_t)amount_to_be_read;
			ChunkBuf = malloc(
				(size_t)(Data_Buf_Size + CHUNK_HEADER_SIZE +
					 CHUNK_TAIL_SIZE));
			if (!ChunkBuf) {
				RetVal = UPNP_E_OUTOF_MEMORY;
				goto ExitFunction;
			}
			file_buf = ChunkBuf + CHUNK_HEADER_SIZE;
		} else if (c == 'f') {
			/* file name */
			filename = va_arg(argp, char *);
			if (Instr && Instr->IsVirtualFile)
				Fp = (virtualDirCallback.open)(filename,
					UPNP_READ,
					Instr->Cookie,
					Instr->RequestCookie);
			else
	#ifdef _WIN32
				fopen_s(&Fp, filename, "rb");
	#else
				Fp = fopen(filename, "rb");
	#endif
			if (Fp == NULL) {
				RetVal = UPNP_E_FILE_READ_ERROR;
				goto ExitFunction;
			}
			if (Instr && Instr->IsRangeActive &&
				Instr->IsVirtualFile) {
				if (virtualDirCallback.seek(Fp,
					    Instr->RangeOffset,
					    SEEK_CUR,
					    Instr->Cookie,
					    Instr->RequestCookie) != 0) {
					RetVal = UPNP_E_FILE_READ_ERROR;
					goto Cleanup_File;
				}
			} else if (Instr && Instr->IsRangeActive) {
				if (fseeko(Fp, Instr->RangeOffset, SEEK_CUR) !=
					0) {
					RetVal = UPNP_E_FILE_READ_ERROR;
					goto Cleanup_File;
				}
			}
			while (amount_to_be_read) {
				if (Instr) {
					int nr;
					size_t n =
						amount_to_be_read >=
								(off_t)Data_Buf_Size
							? Data_Buf_Size
							: (size_t)amount_to_be_read;
					if (Instr->IsVirtualFile) {
						nr = virtualDirCallback.read(Fp,
							file_buf,
							n,
							Instr->Cookie,
							Instr->RequestCookie);
						num_read = (size_t)nr;
					} else {
						num_read = fread(file_buf,
							(size_t)1,
							n,
							Fp);
					}
					amount_to_be_read -= (off_t)num_read;
					if (Instr->ReadSendSize < 0) {
						/* read until close */
						amount_to_be_read =
							(off_t)Data_Buf_Size;
					}
				} else {
					num_read = fread(file_buf,
						(size_t)1,
						Data_Buf_Size,
						Fp);
				}
				if (num_read == (size_t)0) {
					/* EOF so no more to send. */
					if (Instr && Instr->IsChunkActive) {
						const char *str = "0\r\n\r\n";
						nw = sock_write(info,
							str,
							strlen(str),
							TimeOut);
					} else {
						RetVal = UPNP_E_FILE_READ_ERROR;
					}
					goto Cleanup_File;
				}
				/* Create chunk for the current buffer. */
				if (Instr && Instr->IsChunkActive) {
					int rc;
					/* Copy CRLF at the end of the chunk */
					memcpy(file_buf + num_read,
						"\r\n",
						(size_t)2);
					/* Hex length for the chunk size. */
					memset(Chunk_Header,
						0,
						sizeof(Chunk_Header));
					rc = snprintf(Chunk_Header,
						sizeof(Chunk_Header),
						"%" PRIzx "\r\n",
						num_read);
					if (rc < 0 ||
						(unsigned int)rc >=
							sizeof(Chunk_Header)) {
						RetVal = UPNP_E_INTERNAL_ERROR;
						goto Cleanup_File;
					}
					/* Copy the chunk size header  */
					memcpy(file_buf - strlen(Chunk_Header),
						Chunk_Header,
						strlen(Chunk_Header));
					/* on the top of the buffer. */
					/*file_buf[num_read+strlen(Chunk_Header)]
					 * = NULL; */
					/*upnpprintf("Sending
					 * %s\n",file_buf-strlen(Chunk_Header));*/
					nw = sock_write(info,
						file_buf - strlen(Chunk_Header),
						num_read +
							strlen(Chunk_Header) +
							(size_t)2,
						TimeOut);
					num_written = (size_t)nw;
					if (nw <= 0 ||
						num_written !=
							num_read +
								strlen(Chunk_Header) +
								(size_t)2)
						/* Send error nothing we can do.
						 */
						goto Cleanup_File;
				} else {
					/* write data */
					nw = sock_write(info,
						file_buf,
						num_read,
						TimeOut);
					UpnpPrintf(UPNP_INFO,
						HTTP,
						__FILE__,
						__LINE__,
						">>> (SENT) "
						">>>\n%.*s\n------------\n",
						nw,
						file_buf);
					/* Send error nothing we can do */
					num_written = (size_t)nw;
					if (nw <= 0 ||
						num_written != num_read) {
						goto Cleanup_File;
					}
				}
			} /* while */
		Cleanup_File:
			if (Instr && Instr->IsVirtualFile) {
				virtualDirCallback.close(Fp,
					Instr->Cookie,
					Instr->RequestCookie);
			} else {
				fclose(Fp);
			}
			goto ExitFunction;
		} else
#endif /* EXCLUDE_WEB_SERVER */
			if (c == 'b') {
				/* memory buffer */
				buf = va_arg(argp, char *);
				buf_length = va_arg(argp, size_t);
				if (buf_length > (size_t)0) {
					nw = sock_write(
						info, buf, buf_length, TimeOut);
					num_written = (size_t)nw;
					UpnpPrintf(UPNP_INFO,
						HTTP,
						__FILE__,
						__LINE__,
						">>> (SENT) >>>\n"
						"%.*s\nbuf_length=%" PRIzd
						", num_written=%" PRIzd "\n"
						"------------\n",
						(int)buf_length,
						buf,
						buf_length,
						num_written);
					if (num_written != buf_length) {
						RetVal = 0;
						goto ExitFunction;
					}
				}
			}
	}

ExitFunction:
	va_end(argp);
#if EXCLUDE_WEB_SERVER == 0
	free(ChunkBuf);
#endif /* EXCLUDE_WEB_SERVER */
	return RetVal;
}